

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
::moveFromOldBuckets
          (DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
           *this,DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*> *OldBucketsBegin,
          DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*> *OldBucketsEnd)

{
  unsigned_long uVar1;
  bool bVar2;
  unsigned_long *puVar3;
  CIE **ppCVar4;
  CIE **ppCVar5;
  DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*> *pDStack_48;
  bool FoundVal;
  DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*> *DestBucket;
  DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*> *E;
  DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*> *B;
  unsigned_long TombstoneKey;
  unsigned_long EmptyKey;
  DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*> *OldBucketsEnd_local;
  DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*> *OldBucketsBegin_local;
  DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
  *this_local;
  
  EmptyKey = (unsigned_long)OldBucketsEnd;
  OldBucketsEnd_local = OldBucketsBegin;
  OldBucketsBegin_local = (DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*> *)this;
  initEmpty(this);
  TombstoneKey = getEmptyKey();
  B = (DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*> *)getTombstoneKey();
  E = OldBucketsEnd_local;
  DestBucket = (DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*> *)EmptyKey;
  do {
    if (E == DestBucket) {
      return;
    }
    puVar3 = detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>::getFirst(E);
    bVar2 = DenseMapInfo<unsigned_long>::isEqual(puVar3,&TombstoneKey);
    if (!bVar2) {
      puVar3 = detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>::getFirst(E);
      bVar2 = DenseMapInfo<unsigned_long>::isEqual(puVar3,(unsigned_long *)&B);
      if (!bVar2) {
        puVar3 = detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>::getFirst(E);
        bVar2 = LookupBucketFor<unsigned_long>(this,puVar3,&stack0xffffffffffffffb8);
        if (bVar2) {
          __assert_fail("!FoundVal && \"Key already in new map?\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                        ,0x17a,
                        "void llvm::DenseMapBase<llvm::DenseMap<unsigned long, llvm::dwarf::CIE *>, unsigned long, llvm::dwarf::CIE *, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseMapPair<unsigned long, llvm::dwarf::CIE *>>::moveFromOldBuckets(BucketT *, BucketT *) [DerivedT = llvm::DenseMap<unsigned long, llvm::dwarf::CIE *>, KeyT = unsigned long, ValueT = llvm::dwarf::CIE *, KeyInfoT = llvm::DenseMapInfo<unsigned long>, BucketT = llvm::detail::DenseMapPair<unsigned long, llvm::dwarf::CIE *>]"
                       );
        }
        puVar3 = detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>::getFirst(E);
        uVar1 = *puVar3;
        puVar3 = detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>::getFirst(pDStack_48);
        *puVar3 = uVar1;
        ppCVar4 = detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>::getSecond(pDStack_48);
        ppCVar5 = detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>::getSecond(E);
        *ppCVar4 = *ppCVar5;
        incrementNumEntries(this);
        detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>::getSecond(E);
      }
    }
    detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>::getFirst(E);
    E = E + 1;
  } while( true );
}

Assistant:

void moveFromOldBuckets(BucketT *OldBucketsBegin, BucketT *OldBucketsEnd) {
    initEmpty();

    // Insert all the old elements.
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    for (BucketT *B = OldBucketsBegin, *E = OldBucketsEnd; B != E; ++B) {
      if (!KeyInfoT::isEqual(B->getFirst(), EmptyKey) &&
          !KeyInfoT::isEqual(B->getFirst(), TombstoneKey)) {
        // Insert the key/value into the new table.
        BucketT *DestBucket;
        bool FoundVal = LookupBucketFor(B->getFirst(), DestBucket);
        (void)FoundVal; // silence warning.
        assert(!FoundVal && "Key already in new map?");
        DestBucket->getFirst() = std::move(B->getFirst());
        ::new (&DestBucket->getSecond()) ValueT(std::move(B->getSecond()));
        incrementNumEntries();

        // Free the value.
        B->getSecond().~ValueT();
      }
      B->getFirst().~KeyT();
    }
  }